

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O3

void read_compare(roaring_bitmap_t *r,uint32_t *ref_values,uint32_t ref_count,uint32_t step)

{
  uint32_t uVar1;
  uint32_t uVar2;
  roaring_uint32_iterator_t *it;
  uint32_t *buf;
  ulong uVar3;
  ulong uVar4;
  uint32_t i;
  
  it = roaring_iterator_create(r);
  uVar4 = 0x10000;
  if (step != 0xffffffff) {
    uVar4 = (ulong)step;
  }
  buf = (uint32_t *)malloc(uVar4 << 2);
  if (ref_count != 0) {
    do {
      _assert_true((ulong)it->has_value,"iter->has_value == true",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                   ,0xf68);
      _assert_true((ulong)(it->current_value == *ref_values),"iter->current_value == ref_values[0]",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                   ,0xf69);
      uVar2 = step;
      if (step == 0xffffffff) {
        uVar4 = 0;
        do {
          uVar3 = uVar4;
          if (0xffff < (ref_values[uVar4] ^ *ref_values)) break;
          uVar4 = uVar4 + 1;
          uVar3 = (ulong)ref_count;
        } while (ref_count != uVar4);
        uVar2 = (uint32_t)uVar3;
      }
      uVar1 = roaring_uint32_iterator_read(it,buf,uVar2);
      if (ref_count <= uVar2) {
        uVar2 = ref_count;
      }
      _assert_true((ulong)(uVar1 == uVar2),"num_got == minimum_uint32(num_ask, ref_count)",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                   ,0xf78);
      if (uVar1 == 0) {
        uVar4 = 0;
      }
      else {
        uVar4 = (ulong)uVar1;
        uVar3 = 0;
        do {
          _assert_true((ulong)(ref_values[uVar3] == buf[uVar3]),"ref_values[i] == buffer[i]",
                       "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                       ,0xf7a);
          uVar3 = uVar3 + 1;
        } while (uVar4 != uVar3);
      }
      ref_values = ref_values + uVar4;
      ref_count = ref_count - uVar1;
    } while (ref_count != 0);
  }
  _assert_true((ulong)it->has_value ^ 1,"iter->has_value == false",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xf80);
  _assert_true((ulong)(it->current_value == 0xffffffff),"iter->current_value == UINT32_MAX",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xf81);
  uVar2 = roaring_uint32_iterator_read(it,buf,step);
  _assert_true((ulong)(uVar2 == 0),"roaring_uint32_iterator_read(iter, buffer, step) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xf83);
  _assert_true((ulong)it->has_value ^ 1,"iter->has_value == false",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xf84);
  _assert_true((ulong)(it->current_value == 0xffffffff),"iter->current_value == UINT32_MAX",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xf85);
  free(buf);
  roaring_uint32_iterator_free(it);
  return;
}

Assistant:

void read_compare(roaring_bitmap_t *r, const uint32_t *ref_values,
                  uint32_t ref_count, uint32_t step) {
    roaring_uint32_iterator_t *iter = roaring_iterator_create(r);
    uint32_t *buffer = (uint32_t *)malloc(sizeof(uint32_t) *
                                          (step == UINT32_MAX ? 65536 : step));
    while (ref_count > 0) {
        assert_true(iter->has_value == true);
        assert_true(iter->current_value == ref_values[0]);

        uint32_t num_ask = step;
        if (step == UINT32_MAX) {
            num_ask = 0;
            for (uint32_t i = 0; i < ref_count; i++) {
                if ((ref_values[i] >> 16) == (ref_values[0] >> 16)) {
                    num_ask++;
                } else {
                    break;
                }
            }
        }

        uint32_t num_got = roaring_uint32_iterator_read(iter, buffer, num_ask);
        assert_true(num_got == minimum_uint32(num_ask, ref_count));
        for (uint32_t i = 0; i < num_got; i++) {
            assert_true(ref_values[i] == buffer[i]);
        }
        ref_values += num_got;
        ref_count -= num_got;
    }

    assert_true(iter->has_value == false);
    assert_true(iter->current_value == UINT32_MAX);

    assert_true(roaring_uint32_iterator_read(iter, buffer, step) == 0);
    assert_true(iter->has_value == false);
    assert_true(iter->current_value == UINT32_MAX);

    free(buffer);
    roaring_uint32_iterator_free(iter);
}